

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O1

int main(void)

{
  function<void_()> *pfVar1;
  uint uVar2;
  int iVar3;
  undefined **ppuVar4;
  Exception *this;
  error_code ec;
  Timer timer;
  Loop loop;
  _Any_data local_478;
  code *local_468;
  code *local_460;
  Timer local_450;
  Loop local_378;
  
  local_450.super_Handle<uv_timer_s>.handle_.data = &local_450;
  local_450.super_Handle<uv_timer_s>.closeHandler_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_450.super_Handle<uv_timer_s>.closeHandler_.super__Function_base._M_functor._8_8_ = 0;
  local_450.super_Handle<uv_timer_s>.closeHandler_._M_invoker =
       std::
       _Function_handler<void_(),_uv::Handle<uv_timer_s>::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/../include/uv++/Handle.hpp:28:41)>
       ::_M_invoke;
  local_450.super_Handle<uv_timer_s>.closeHandler_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_uv::Handle<uv_timer_s>::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/../include/uv++/Handle.hpp:28:41)>
       ::_M_manager;
  local_450.startHandler_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_450.startHandler_.super__Function_base._M_functor._8_8_ = 0;
  local_450.startHandler_._M_invoker =
       std::
       _Function_handler<void_(),_uv::Timer::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/../include/uv++/Timer.hpp:30:48)>
       ::_M_invoke;
  local_450.startHandler_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_uv::Timer::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/../include/uv++/Timer.hpp:30:48)>
       ::_M_manager;
  ppuVar4 = (undefined **)std::_V2::system_category();
  local_378.loop_ptr_ = &local_378.loop_;
  uVar2 = uv_loop_init(&local_378);
  if (uVar2 == 0) {
    if ((Loop *)local_378.loop_ptr_ != (Loop *)0x0) {
      ((uv_loop_t *)&(local_378.loop_ptr_)->data)->data = &local_378;
      uVar2 = 0;
      goto LAB_00102401;
    }
    uVar2 = 0xc;
  }
  ppuVar4 = &uv::getCategory()::instance;
  if ((uv::getCategory()::instance == '\0') &&
     (iVar3 = __cxa_guard_acquire(&uv::getCategory()::instance), iVar3 != 0)) {
    ppuVar4 = &uv::getCategory()::instance;
    __cxa_atexit(std::_V2::error_category::~error_category,&uv::getCategory()::instance,
                 &__dso_handle);
    __cxa_guard_release(&uv::getCategory()::instance);
  }
LAB_00102401:
  if (uVar2 != 0) {
    this = (Exception *)__cxa_allocate_exception(0x38);
    ec._4_4_ = 0;
    ec._M_value = uVar2;
    ec._M_cat = (error_category *)ppuVar4;
    uv::Exception::Exception(this,ec);
    __cxa_throw(this,&uv::Exception::typeinfo,uv::Exception::~Exception);
  }
  uv::Timer::init(&local_450,(EVP_PKEY_CTX *)&local_378);
  local_478._M_unused._M_object = (void *)0x0;
  local_478._8_8_ = 0;
  local_460 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/timer.cpp:13:15)>
              ::_M_invoke;
  local_468 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/timer.cpp:13:15)>
              ::_M_manager;
  uv::Timer::start(&local_450,(function<void_()> *)&local_478,1000,1000);
  if (local_468 != (code *)0x0) {
    (*local_468)(&local_478,&local_478,__destroy_functor);
  }
  uv::Loop::run(&local_378);
  if (local_450.startHandler_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_450.startHandler_.super__Function_base._M_manager)
              ((_Any_data *)&local_450.startHandler_,(_Any_data *)&local_450.startHandler_,
               __destroy_functor);
  }
  if (local_450.super_Handle<uv_timer_s>.closeHandler_.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    pfVar1 = &local_450.super_Handle<uv_timer_s>.closeHandler_;
    (*local_450.super_Handle<uv_timer_s>.closeHandler_.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  uv_loop_close(local_378.loop_ptr_);
  return 0;
}

Assistant:

int main()
{
	uv::Loop loop;
	uv::Timer timer;

	try {
		loop.init();
		timer.init(loop);

		timer.start([]() {
			std::cout << "Hello,World" << std::endl;
		}, 1000, 1000);

		loop.run();
	}
	catch (const uv::Exception &ex) {
		std::cout << ex.what() << std::endl;
	}
}